

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  bool bVar2;
  Vdbe *pVVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  Mem *pMVar7;
  char **ppcVar8;
  char *pcVar9;
  char *pcVar10;
  char **ppcVar11;
  ulong uVar12;
  Vdbe *pVm;
  ulong uVar13;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_78;
  char **local_70;
  uint local_64;
  sqlite3 *local_60;
  char *local_58;
  char **local_50;
  sqlite3_callback local_48;
  char **local_40;
  void *local_38;
  
  local_78 = (Vdbe *)0x0;
  local_48 = xCallback;
  local_38 = pArg;
  iVar4 = sqlite3SafetyCheckOk(db);
  if (iVar4 == 0) {
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1d0a3,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    uVar5 = 0x15;
  }
  else {
    pcVar10 = "";
    if (zSql != (char *)0x0) {
      pcVar10 = zSql;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    local_40 = pzErrMsg;
    if (db->pErr != (sqlite3_value *)0x0) {
      sqlite3ErrorFinish(db,0);
    }
    local_70 = (char **)0x0;
    local_60 = db;
    do {
      if (*pcVar10 == '\0') {
        uVar5 = 0;
        break;
      }
      local_78 = (Vdbe *)0x0;
      uVar5 = sqlite3LockAndPrepare
                        (db,pcVar10,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_78,&local_58);
      iVar4 = 2;
      if (uVar5 == 0) {
        if (local_78 == (Vdbe *)0x0) {
          uVar5 = 0;
          pcVar10 = local_58;
        }
        else {
          bVar2 = false;
          uVar12 = 0;
          ppcVar11 = (char **)0x0;
          do {
            pVVar3 = local_78;
            uVar5 = sqlite3_step((sqlite3_stmt *)local_78);
            if (local_48 == (sqlite3_callback)0x0) {
LAB_00126e3a:
              if (uVar5 == 100) {
                iVar4 = 0;
                uVar5 = 100;
              }
              else {
                uVar5 = sqlite3VdbeFinalize(local_78);
                local_78 = (Vdbe *)0x0;
                pcVar10 = local_58 + -1;
                do {
                  pbVar1 = (byte *)(pcVar10 + 1);
                  pcVar10 = pcVar10 + 1;
                } while ((""[*pbVar1] & 1) != 0);
                iVar4 = 5;
              }
            }
            else {
              if (uVar5 != 100) {
                if (uVar5 == 0x65 && !bVar2) {
                  if ((local_60->flags & 0x100) != 0) goto LAB_00126d24;
                  bVar2 = false;
                }
                goto LAB_00126e3a;
              }
LAB_00126d24:
              local_64 = uVar5;
              if (bVar2) {
LAB_00126d33:
                uVar13 = uVar12;
                if (local_64 == 100) {
                  ppcVar11 = local_70 + uVar12;
                  local_50 = (char **)CONCAT44(local_50._4_4_,(int)uVar12);
                  uVar13 = 0;
                  if (0 < (int)uVar12) {
                    do {
                      puVar6 = sqlite3_column_text((sqlite3_stmt *)local_78,(int)uVar13);
                      pVVar3 = local_78;
                      ppcVar11[uVar13] = (char *)puVar6;
                      if (puVar6 == (uchar *)0x0) {
                        pMVar7 = columnMem((sqlite3_stmt *)local_78,(int)uVar13);
                        uVar5._0_2_ = pMVar7->flags;
                        uVar5._2_1_ = pMVar7->enc;
                        uVar5._3_1_ = pMVar7->eSubtype;
                        columnMallocFailure((sqlite3_stmt *)pVVar3);
                        if ((0xaaaaaaaaU >> (uVar5 & 0x1f) & 1) == 0) {
                          sqlite3OomFault(local_60);
                          iVar4 = 6;
                          bVar2 = true;
                          uVar5 = 100;
                          goto LAB_00126e77;
                        }
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar12 != uVar13);
                  }
                  ppcVar11[uVar13] = (char *)0x0;
                  uVar13 = (ulong)local_50 & 0xffffffff;
                }
                iVar4 = (*local_48)(local_38,(int)uVar13,ppcVar11,local_70);
                if (iVar4 == 0) {
                  bVar2 = true;
                  uVar12 = uVar13;
                  uVar5 = local_64;
                  goto LAB_00126e3a;
                }
                sqlite3VdbeFinalize(local_78);
                local_78 = (Vdbe *)0x0;
                local_60->errCode = 4;
                sqlite3ErrorFinish(local_60,4);
                iVar4 = 6;
                bVar2 = true;
                uVar5 = 4;
              }
              else {
                if (pVVar3 == (Vdbe *)0x0) {
                  uVar5 = 0;
                }
                else {
                  uVar5 = (uint)pVVar3->nResColumn;
                }
                uVar12 = (ulong)uVar5;
                uVar13 = (ulong)(uVar5 << 4 | 8);
                if (local_60 == (sqlite3 *)0x0) {
                  ppcVar8 = (char **)sqlite3Malloc(uVar13);
                }
                else {
                  ppcVar8 = (char **)sqlite3DbMallocRawNN(local_60,uVar13);
                }
                if (ppcVar8 != (char **)0x0) {
                  uVar12 = (ulong)uVar5;
                  local_70 = ppcVar8;
                  if (uVar5 != 0) {
                    uVar13 = 0;
                    local_50 = ppcVar11;
                    do {
                      pcVar9 = (char *)columnName((sqlite3_stmt *)pVVar3,(int)uVar13,0,0);
                      ppcVar8[uVar13] = pcVar9;
                      uVar13 = uVar13 + 1;
                      ppcVar11 = local_50;
                    } while (uVar12 != uVar13);
                  }
                  goto LAB_00126d33;
                }
                iVar4 = 6;
                local_70 = (char **)0x0;
                bVar2 = false;
                uVar5 = local_64;
              }
            }
LAB_00126e77:
            db = local_60;
          } while (iVar4 == 0);
          if (iVar4 == 5) {
            if (local_70 != (char **)0x0) {
              sqlite3DbFreeNN(local_60,local_70);
            }
            local_70 = (char **)0x0;
            iVar4 = 0;
          }
        }
      }
      if ((iVar4 != 0) && (iVar4 != 2)) {
        if (iVar4 != 6) {
          return uVar5;
        }
        break;
      }
    } while (uVar5 == 0);
    if (local_78 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_78);
    }
    ppcVar11 = local_40;
    if (local_70 != (char **)0x0) {
      sqlite3DbFreeNN(db,local_70);
    }
    if ((uVar5 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar5 = 7;
    }
    else {
      uVar5 = uVar5 & db->errMask;
    }
    if ((ppcVar11 == (char **)0x0) || (uVar5 == 0)) {
      if (ppcVar11 != (char **)0x0) {
        *ppcVar11 = (char *)0x0;
      }
    }
    else {
      pcVar10 = sqlite3_errmsg(db);
      pcVar10 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar10);
      *ppcVar11 = pcVar10;
      if (pcVar10 == (char *)0x0) {
        db->errCode = 7;
        uVar5 = 7;
        sqlite3ErrorFinish(db,7);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar5;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}